

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O3

void __thiscall Pathie::Tempfile::Tempfile(Tempfile *this,string *namepart)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (namepart->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + namepart->_M_string_length);
  TempEntry::TempEntry(&this->super_TempEntry,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_00113ce0;
  Path::touch(&(this->super_TempEntry).m_path);
  return;
}

Assistant:

Tempfile::Tempfile(std::string namepart)
  : TempEntry(namepart)
{
  m_path.touch();
}